

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  float *pfVar6;
  char *pcVar7;
  bool bVar8;
  uint c;
  uint local_54;
  char *local_50;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  bVar8 = true;
  local_34 = 0.0;
  pcVar7 = (char *)0x0;
  local_38 = 0.0;
  local_3c = 0.0;
  local_50 = text;
  local_44 = wrap_width;
  local_40 = scale;
  do {
    if (text_end <= text) {
      return text;
    }
    local_54 = (uint)*text;
    uVar4 = 1;
    if (*text < '\0') {
      uVar3 = ImTextCharFromUtf8(&local_54,text,text_end);
      uVar4 = (ulong)uVar3;
      wrap_width = local_44;
    }
    bVar1 = true;
    if ((long)(int)local_54 != 0) {
      pcVar5 = text + uVar4;
      if (local_54 < 0x20) {
        if (local_54 == 10) {
          bVar8 = true;
          local_34 = 0.0;
          bVar1 = false;
          local_38 = 0.0;
          local_3c = 0.0;
          text = pcVar5;
          goto LAB_00155c85;
        }
        if (local_54 != 0xd) goto LAB_00155bce;
      }
      else {
LAB_00155bce:
        pfVar6 = (this->IndexXAdvance).Data + (int)local_54;
        if ((this->IndexXAdvance).Size <= (int)local_54) {
          pfVar6 = &this->FallbackXAdvance;
        }
        if (((local_54 == 9) || (local_54 == 0x20)) || (local_54 == 0x3000)) {
          if (bVar8) {
            local_3c = local_3c + local_38;
            local_38 = 0.0;
          }
          local_38 = local_38 + *pfVar6 * local_40;
LAB_00155c5c:
          bVar8 = false;
        }
        else {
          local_34 = local_34 + *pfVar6 * local_40;
          pcVar2 = pcVar5;
          if (!bVar8) {
            local_3c = local_3c + local_38 + local_34;
            local_34 = 0.0;
            local_38 = 0.0;
            pcVar7 = local_50;
            pcVar2 = local_50;
          }
          local_50 = pcVar2;
          if ((local_54 < 0x40) && ((0x8800500200000000U >> ((ulong)local_54 & 0x3f) & 1) != 0))
          goto LAB_00155c5c;
          bVar8 = local_54 != 0x22;
        }
        if (wrap_width <= local_34 + local_3c) {
          pcVar5 = pcVar7;
          if (pcVar7 == (char *)0x0) {
            pcVar5 = local_50;
          }
          if (local_34 < wrap_width) {
            text = pcVar5;
          }
          goto LAB_00155c85;
        }
      }
      bVar1 = false;
      text = pcVar5;
    }
LAB_00155c85:
    if (bVar1) {
      return text;
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // Simple word-wrapping for English, not full-featured. Please submit failing cases!
    // FIXME: Much possible improvements (don't cut things like "word !", "word!!!" but cut within "word,,,,", more sensible support for punctuations, support for Unicode punctuations, etc.)

    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"

    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexXAdvance.Size ? IndexXAdvance[(int)c] : FallbackXAdvance) * scale;
        if (ImCharIsSpace(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = !(c == '.' || c == ',' || c == ';' || c == '!' || c == '?' || c == '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width >= wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    return s;
}